

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ExpressionResultBuilder * __thiscall
Catch::ExpressionLhs<std::__cxx11::string_const&>::
captureExpression<(Catch::Internal::Operator)0,char[13]>
          (ExpressionLhs<std::__cxx11::string_const&> *this,char (*rhs) [13])

{
  bool result;
  ExpressionResultBuilder *pEVar1;
  char *value;
  allocator<char> local_79;
  string local_78;
  string local_58;
  string local_38;
  
  result = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            (this + 0x228),*rhs);
  pEVar1 = ExpressionResultBuilder::setResultType((ExpressionResultBuilder *)this,result);
  toString(&local_38,*(string **)(this + 0x228));
  pEVar1 = ExpressionResultBuilder::setLhs(pEVar1,&local_38);
  toString_abi_cxx11_(&local_58,(Catch *)rhs,value);
  pEVar1 = ExpressionResultBuilder::setRhs(pEVar1,&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"==",&local_79);
  pEVar1 = ExpressionResultBuilder::setOp(pEVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return pEVar1;
}

Assistant:

ExpressionResultBuilder& captureExpression( const RhsT& rhs ) {
        return m_result
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }